

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXTokenizer.cpp
# Opt level: O2

void Assimp::FBX::anon_unknown_3::TokenizeError(string *message,uint line,uint column)

{
  DeadlyImportError *this;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"FBX-Tokenize",&local_61);
  Util::AddLineAndColumn(&local_40,&local_60,message,line,column);
  DeadlyImportError::DeadlyImportError(this,&local_40);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void TokenizeError(const std::string& message, unsigned int line, unsigned int column)
{
    throw DeadlyImportError(Util::AddLineAndColumn("FBX-Tokenize",message,line,column));
}